

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

void __thiscall Moc::generate(Moc *this,FILE *out,FILE *jsonOutput)

{
  QByteArray *pQVar1;
  long lVar2;
  PropertyDef *pPVar3;
  Data *pDVar4;
  qsizetype qVar5;
  Moc *pMVar6;
  ClassDef *pCVar7;
  bool bVar8;
  char cVar9;
  ClassDef *pCVar10;
  long lVar11;
  iterator classDef;
  iterator iVar12;
  ClassDef *pCVar13;
  long lVar14;
  FILE *pFVar15;
  undefined8 *puVar16;
  ClassDef *cdef;
  QByteArray *pQVar17;
  long lVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QLatin1String QVar27;
  QJsonArray classesJsonFormatted;
  QJsonObject mocData;
  QArrayDataPointer<QByteArray> local_108;
  Generator generator;
  QJsonDocument jsonDoc;
  undefined7 uStack_4f;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  QVar20 = strippedFileName(this);
  QVar27.m_data = QVar20.m_data;
  fprintf((FILE *)out,
          "/****************************************************************************\n** Meta object code from reading C++ file \'%s\'\n**\n"
         );
  fprintf((FILE *)out,"** Created by: The Qt Meta Object Compiler version %d (Qt %s)\n**\n",0x45,
          "6.10.0");
  fwrite("** WARNING! All changes made in this file will be lost!\n*****************************************************************************/\n\n"
         ,0x88,1,(FILE *)out);
  if (this->noInclude == false) {
    lVar18 = (this->includePath).d.size;
    if ((lVar18 != 0) && ((this->includePath).d.ptr[lVar18 + -1] != '/')) {
      QByteArray::append((char)&this->includePath);
    }
    lVar18 = (this->includeFiles).d.size;
    if (lVar18 != 0) {
      pQVar17 = (this->includeFiles).d.ptr;
      pQVar1 = pQVar17 + lVar18;
      do {
        generator.parser = (Moc *)(pQVar17->d).d;
        generator.out = (FILE *)(pQVar17->d).ptr;
        generator.cdef = (ClassDef *)(pQVar17->d).size;
        if (generator.parser != (Moc *)0x0) {
          LOCK();
          ((__atomic_base<int> *)&((generator.parser)->super_Parser).symbols.d.d)->_M_i =
               ((__atomic_base<int> *)&((generator.parser)->super_Parser).symbols.d.d)->_M_i + 1;
          UNLOCK();
        }
        if (((generator.cdef != (ClassDef *)0x0) && (*generator.out != (FILE)0x22)) &&
           (*generator.out != (FILE)0x3c)) {
          if ((this->includePath).d.size != 0) {
            local_108.d = (Data *)0x14261b;
            bVar8 = operator!=(&this->includePath,(char **)&local_108);
            if (bVar8) {
              QByteArray::prepend((QByteArray *)&generator);
            }
          }
          _jsonDoc = (QByteArray *)CONCAT71(uStack_4f,0x22);
          QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char>::convertTo<QByteArray>
                    ((QByteArray *)&local_108,
                     (QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char> *)&jsonDoc);
          pFVar15 = generator.out;
          pMVar6 = generator.parser;
          qVar5 = local_108.size;
          pDVar4 = local_108.d;
          local_108.d = (Data *)generator.parser;
          generator.parser = (Moc *)pDVar4;
          generator.out = (FILE *)local_108.ptr;
          local_108.ptr = (QByteArray *)pFVar15;
          local_108.size = (qsizetype)generator.cdef;
          generator.cdef = (ClassDef *)qVar5;
          if (pMVar6 != (Moc *)0x0) {
            LOCK();
            *(int *)&(pMVar6->super_Parser).symbols.d.d =
                 *(int *)&(pMVar6->super_Parser).symbols.d.d + -1;
            UNLOCK();
            if (*(int *)&(pMVar6->super_Parser).symbols.d.d == 0) {
              QArrayData::deallocate((QArrayData *)pMVar6,1,0x10);
            }
          }
        }
        pFVar15 = generator.out;
        if (generator.out == (FILE *)0x0) {
          pFVar15 = (FILE *)&QByteArray::_empty;
        }
        fprintf((FILE *)out,"#include %s\n",pFVar15);
        if (generator.parser != (Moc *)0x0) {
          LOCK();
          *(int *)&((generator.parser)->super_Parser).symbols.d.d =
               *(int *)&((generator.parser)->super_Parser).symbols.d.d + -1;
          UNLOCK();
          if (*(int *)&((generator.parser)->super_Parser).symbols.d.d == 0) {
            QArrayData::deallocate((QArrayData *)generator.parser,1,0x10);
          }
        }
        pQVar17 = pQVar17 + 1;
      } while (pQVar17 != pQVar1);
    }
  }
  if ((this->classList).d.size != 0) {
    generator.parser = (Moc *)anon_var_dwarf_3fca4;
    bVar8 = operator==((QByteArray *)(this->classList).d.ptr,(char **)&generator);
    if (bVar8) {
      fwrite("#include <QtCore/qobject.h>\n",0x1c,1,(FILE *)out);
    }
  }
  fwrite("#include <QtCore/qmetatype.h>\n",0x1e,1,(FILE *)out);
  if (this->mustIncludeQPluginH == true) {
    fwrite("#include <QtCore/qplugin.h>\n",0x1c,1,(FILE *)out);
  }
  local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_108.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  if (requiredQtContainers(QList<ClassDef>const&)::candidates == '\0') {
    generate();
  }
  local_108.d = (Data *)0x0;
  local_108.ptr = (QByteArray *)0x0;
  local_108.size = 0;
  QList<QByteArray>::reserve
            ((QList<QByteArray> *)&local_108,
             requiredQtContainers(QList<ClassDef>const&)::candidates._16_8_);
  if (requiredQtContainers(QList<ClassDef>const&)::candidates._16_8_ != 0) {
    pQVar1 = (QByteArray *)
             (requiredQtContainers(QList<ClassDef>const&)::candidates._8_8_ +
             requiredQtContainers(QList<ClassDef>const&)::candidates._16_8_ * 0x18);
    bVar8 = false;
    pQVar17 = (QByteArray *)requiredQtContainers(QList<ClassDef>const&)::candidates._8_8_;
    do {
      generator.cdef = (ClassDef *)&DAT_aaaaaaaaaaaaaaaa;
      generator.parser = (Moc *)&DAT_aaaaaaaaaaaaaaaa;
      generator.out = (FILE *)&DAT_aaaaaaaaaaaaaaaa;
      _jsonDoc = pQVar17;
      QStringBuilder<const_QByteArray_&,_char>::convertTo<QByteArray>
                ((QByteArray *)&generator,(QStringBuilder<const_QByteArray_&,_char> *)&jsonDoc);
      pCVar7 = generator.cdef;
      pFVar15 = generator.out;
      lVar18 = (this->classList).d.size;
      if (lVar18 != 0) {
        pCVar13 = (this->classList).d.ptr;
        pCVar10 = pCVar13 + lVar18;
        do {
          pPVar3 = (pCVar13->propertyList).d.ptr;
          lVar18 = (pCVar13->propertyList).d.size;
          if (lVar18 != 0) {
            lVar14 = 0;
            do {
              bVar8 = (bool)(bVar8 | *(long *)((long)&(pPVar3->bind).d.size + lVar14) != 0);
              lVar14 = lVar14 + 0x158;
            } while (lVar18 * 0x158 - lVar14 != 0);
          }
          bVar19 = lVar18 == 0;
          if (!bVar19) {
            QVar20.m_data = (pPVar3->type).d.ptr;
            QVar20.m_size = (pPVar3->type).d.size;
            QVar25.m_data = (storage_type *)pFVar15;
            QVar25.m_size = (qsizetype)pCVar7;
            lVar14 = QtPrivate::findByteArray(QVar20,0,QVar25);
            if (lVar14 == -1) {
              lVar14 = 0;
              while (bVar19 = lVar18 * 0x158 + -0x158 == lVar14, !bVar19) {
                QVar21.m_data = *(storage_type **)((long)&pPVar3[1].type.d.ptr + lVar14);
                QVar21.m_size = *(qsizetype *)((long)&pPVar3[1].type.d.size + lVar14);
                QVar26.m_data = (storage_type *)pFVar15;
                QVar26.m_size = (qsizetype)pCVar7;
                lVar11 = QtPrivate::findByteArray(QVar21,0,QVar26);
                lVar14 = lVar14 + 0x158;
                if (lVar11 != -1) goto LAB_0011ec7e;
              }
              goto LAB_0011ec0e;
            }
LAB_0011ec7e:
            QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
                      ((QMovableArrayOps<QByteArray> *)&local_108,local_108.size,pQVar17);
            QList<QByteArray>::end((QList<QByteArray> *)&local_108);
            break;
          }
LAB_0011ec0e:
          if (((!bVar19) ||
              (bVar19 = any_arg_contains(&pCVar13->slotList,(QByteArray *)&generator), bVar19)) ||
             ((bVar19 = any_arg_contains(&pCVar13->signalList,(QByteArray *)&generator), bVar19 ||
              (bVar19 = any_arg_contains(&pCVar13->methodList,(QByteArray *)&generator), bVar19))))
          goto LAB_0011ec7e;
          pCVar13 = pCVar13 + 1;
        } while (pCVar13 != pCVar10);
      }
      if (generator.parser != (Moc *)0x0) {
        LOCK();
        *(int *)&((generator.parser)->super_Parser).symbols.d.d =
             *(int *)&((generator.parser)->super_Parser).symbols.d.d + -1;
        UNLOCK();
        if (*(int *)&((generator.parser)->super_Parser).symbols.d.d == 0) {
          QArrayData::deallocate((QArrayData *)generator.parser,1,0x10);
        }
      }
      pQVar17 = pQVar17 + 1;
    } while (pQVar17 != pQVar1);
    if (bVar8) {
      QByteArray::QByteArray((QByteArray *)&generator,"QProperty",-1);
      QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                ((QMovableArrayOps<QByteArray> *)&local_108,local_108.size,(QByteArray *)&generator)
      ;
      QList<QByteArray>::end((QList<QByteArray> *)&local_108);
      if (generator.parser != (Moc *)0x0) {
        LOCK();
        *(int *)&((generator.parser)->super_Parser).symbols.d.d =
             *(int *)&((generator.parser)->super_Parser).symbols.d.d + -1;
        UNLOCK();
        if (*(int *)&((generator.parser)->super_Parser).symbols.d.d == 0) {
          QArrayData::deallocate((QArrayData *)generator.parser,1,0x10);
        }
      }
    }
  }
  pQVar1 = local_108.ptr;
  if (local_108.size != 0) {
    lVar18 = local_108.size * 0x18;
    lVar14 = 0;
    do {
      puVar16 = *(undefined8 **)((long)&(pQVar1->d).ptr + lVar14);
      if (puVar16 == (undefined8 *)0x0) {
        puVar16 = &QByteArray::_empty;
      }
      fprintf((FILE *)out,"#include <QtCore/%s>\n",puVar16);
      lVar14 = lVar14 + 0x18;
    } while (lVar18 != lVar14);
  }
  fwrite("\n#include <QtCore/qtmochelpers.h>\n",0x22,1,(FILE *)out);
  fwrite("\n#include <memory>\n\n",0x14,1,(FILE *)out);
  fwrite("\n#include <QtCore/qxptype_traits.h>\n",0x24,1,(FILE *)out);
  fprintf((FILE *)out,
          "#if !defined(Q_MOC_OUTPUT_REVISION)\n#error \"The header file \'%s\' doesn\'t include <QObject>.\"\n"
          ,QVar27.m_data);
  fprintf((FILE *)out,"#elif Q_MOC_OUTPUT_REVISION != %d\n",0x45);
  fprintf((FILE *)out,
          "#error \"This file was generated using the moc from %s. It\"\n#error \"cannot be used with the include files from this version of Qt.\"\n#error \"(The moc has changed too much.)\"\n"
          ,"6.10.0");
  fwrite("#endif\n\n",8,1,(FILE *)out);
  fwrite("#ifndef Q_CONSTINIT\n#define Q_CONSTINIT\n#endif\n\n",0x30,1,(FILE *)out);
  fwrite("QT_WARNING_PUSH\n",0x10,1,(FILE *)out);
  fwrite("QT_WARNING_DISABLE_DEPRECATED\n",0x1e,1,(FILE *)out);
  fwrite("QT_WARNING_DISABLE_GCC(\"-Wuseless-cast\")\n",0x29,1,(FILE *)out);
  fputs("",(FILE *)out);
  classDef = QList<ClassDef>::begin(&this->classList);
  iVar12 = QList<ClassDef>::end(&this->classList);
  if (classDef.i != iVar12.i) {
    do {
      memset(&generator,0xaa,0x90);
      Generator::Generator
                (&generator,this,classDef.i,&this->metaTypes,&this->knownQObjectClasses,
                 &this->knownGadgets,out,this->requireCompleteTypes);
      Generator::generateCode(&generator);
      if (0x7ffffffe < (ulong)generator.strings.d.size) {
        Parser::error(&this->super_Parser,
                      "internal limit exceeded: number of parsed strings is too big.");
      }
      QHash<QByteArray,_QByteArray>::~QHash(&generator.knownGadgets);
      QHash<QByteArray,_QByteArray>::~QHash(&generator.knownQObjectClasses);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&generator.metaTypes.d);
      if (generator.purestSuperClass.d.d != (Data *)0x0) {
        LOCK();
        ((generator.purestSuperClass.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i = ((generator.purestSuperClass.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((generator.purestSuperClass.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(generator.purestSuperClass.d.d)->super_QArrayData,1,0x10);
        }
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&generator.strings.d);
      if (generator.meta_data.d.d != (Data *)0x0) {
        LOCK();
        ((generator.meta_data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((generator.meta_data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((generator.meta_data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(generator.meta_data.d.d)->super_QArrayData,4,0x10);
        }
      }
      classDef.i = classDef.i + 1;
    } while (classDef.i != iVar12.i);
  }
  fputs("",(FILE *)out);
  fwrite("QT_WARNING_POP\n",0xf,1,(FILE *)out);
  if (jsonOutput != (FILE *)0x0) {
    _mocData = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject(&mocData);
    QJsonValue::QJsonValue((QJsonValue *)&generator,0x45);
    QVar22.m_data = (char *)0xe;
    QVar22.m_size = (qsizetype)&mocData;
    _jsonDoc = (QByteArray *)QJsonObject::operator[](QVar22);
    QJsonValueRef::operator=((QJsonValueRef *)&jsonDoc,(QJsonValue *)&generator);
    QJsonValue::~QJsonValue((QJsonValue *)&generator);
    if (QVar27.m_data == (storage_type *)0x0) {
      lVar18 = 0;
    }
    else {
      lVar14 = -1;
      do {
        lVar18 = lVar14 + 1;
        lVar11 = lVar14 + 1;
        lVar14 = lVar18;
      } while (QVar27.m_data[lVar11] != '\0');
    }
    QVar27.m_size = lVar18;
    QJsonValue::QJsonValue((QJsonValue *)&generator,QVar27);
    QVar23.m_data = (char *)0x9;
    QVar23.m_size = (qsizetype)&mocData;
    _jsonDoc = (QByteArray *)QJsonObject::operator[](QVar23);
    QJsonValueRef::operator=((QJsonValueRef *)&jsonDoc,(QJsonValue *)&generator);
    QJsonValue::~QJsonValue((QJsonValue *)&generator);
    _classesJsonFormatted = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray(&classesJsonFormatted);
    lVar18 = (this->classList).d.size;
    if (lVar18 != 0) {
      lVar18 = lVar18 * 0x1a8;
      do {
        ClassDef::toJson((ClassDef *)&jsonDoc);
        QJsonValue::QJsonValue((QJsonValue *)&generator,(QJsonObject *)&jsonDoc);
        QJsonArray::append((QJsonValue *)&classesJsonFormatted);
        QJsonValue::~QJsonValue((QJsonValue *)&generator);
        QJsonObject::~QJsonObject((QJsonObject *)&jsonDoc);
        lVar18 = lVar18 + -0x1a8;
      } while (lVar18 != 0);
    }
    cVar9 = QJsonArray::isEmpty();
    if (cVar9 == '\0') {
      QJsonValue::QJsonValue((QJsonValue *)&generator,&classesJsonFormatted);
      QVar24.m_data = (char *)0x7;
      QVar24.m_size = (qsizetype)&mocData;
      _jsonDoc = (QByteArray *)QJsonObject::operator[](QVar24);
      QJsonValueRef::operator=((QJsonValueRef *)&jsonDoc,(QJsonValue *)&generator);
      QJsonValue::~QJsonValue((QJsonValue *)&generator);
    }
    _jsonDoc = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::QJsonDocument(&jsonDoc,&mocData);
    QJsonDocument::toJson(&generator,&jsonDoc,0);
    pFVar15 = generator.out;
    if (generator.out == (FILE *)0x0) {
      pFVar15 = (FILE *)&QByteArray::_empty;
    }
    fputs((char *)pFVar15,(FILE *)jsonOutput);
    if (generator.parser != (Moc *)0x0) {
      LOCK();
      *(int *)&((generator.parser)->super_Parser).symbols.d.d =
           *(int *)&((generator.parser)->super_Parser).symbols.d.d + -1;
      UNLOCK();
      if (*(int *)&((generator.parser)->super_Parser).symbols.d.d == 0) {
        QArrayData::deallocate((QArrayData *)generator.parser,1,0x10);
      }
    }
    QJsonDocument::~QJsonDocument(&jsonDoc);
    QJsonArray::~QJsonArray(&classesJsonFormatted);
    QJsonObject::~QJsonObject(&mocData);
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::generate(FILE *out, FILE *jsonOutput)
{
    QByteArrayView fn = strippedFileName();

    fprintf(out, "/****************************************************************************\n"
            "** Meta object code from reading C++ file '%s'\n**\n" , fn.constData());
    fprintf(out, "** Created by: The Qt Meta Object Compiler version %d (Qt %s)\n**\n" , mocOutputRevision, QT_VERSION_STR);
    fprintf(out, "** WARNING! All changes made in this file will be lost!\n"
            "*****************************************************************************/\n\n");

    // include header(s) of user class definitions at _first_ to allow
    // for preprocessor definitions possibly affecting standard headers.
    // see https://codereview.qt-project.org/c/qt/qtbase/+/445937
    if (!noInclude) {
        if (includePath.size() && !includePath.endsWith('/'))
            includePath += '/';
        for (QByteArray inc : std::as_const(includeFiles)) {
            if (!inc.isEmpty() && inc.at(0) != '<' && inc.at(0) != '"') {
                if (includePath.size() && includePath != "./")
                    inc.prepend(includePath);
                inc = '\"' + inc + '\"';
            }
            fprintf(out, "#include %s\n", inc.constData());
        }
    }
    if (classList.size() && classList.constFirst().classname == "Qt")
        fprintf(out, "#include <QtCore/qobject.h>\n");

    fprintf(out, "#include <QtCore/qmetatype.h>\n");  // For QMetaType::Type
    if (mustIncludeQPluginH)
        fprintf(out, "#include <QtCore/qplugin.h>\n");

    const auto qtContainers = requiredQtContainers(classList);
    for (const QByteArray &qtContainer : qtContainers)
        fprintf(out, "#include <QtCore/%s>\n", qtContainer.constData());

    fprintf(out, "\n#include <QtCore/qtmochelpers.h>\n");

    fprintf(out, "\n#include <memory>\n\n");  // For std::addressof
    fprintf(out, "\n#include <QtCore/qxptype_traits.h>\n"); // is_detected

    fprintf(out, "#if !defined(Q_MOC_OUTPUT_REVISION)\n"
            "#error \"The header file '%s' doesn't include <QObject>.\"\n", fn.constData());
    fprintf(out, "#elif Q_MOC_OUTPUT_REVISION != %d\n", mocOutputRevision);
    fprintf(out, "#error \"This file was generated using the moc from %s."
            " It\"\n#error \"cannot be used with the include files from"
            " this version of Qt.\"\n#error \"(The moc has changed too"
            " much.)\"\n", QT_VERSION_STR);
    fprintf(out, "#endif\n\n");

#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0)
    fprintf(out, "#ifndef Q_CONSTINIT\n"
            "#define Q_CONSTINIT\n"
            "#endif\n\n");
#endif

    fprintf(out, "QT_WARNING_PUSH\n");
    fprintf(out, "QT_WARNING_DISABLE_DEPRECATED\n");
    fprintf(out, "QT_WARNING_DISABLE_GCC(\"-Wuseless-cast\")\n");

    fputs("", out);
    for (ClassDef &def : classList) {
        Generator generator(this, &def, metaTypes, knownQObjectClasses, knownGadgets, out,
                            requireCompleteTypes);
        generator.generateCode();

        // generator.generateCode() should have already registered all strings
        if (Q_UNLIKELY(generator.registeredStringsCount() >= std::numeric_limits<int>::max())) {
            error("internal limit exceeded: number of parsed strings is too big.");
            exit(EXIT_FAILURE);
        }
    }
    fputs("", out);

    fprintf(out, "QT_WARNING_POP\n");

    if (jsonOutput) {
        QJsonObject mocData;
        mocData["outputRevision"_L1] = mocOutputRevision;
        mocData["inputFile"_L1] = QLatin1StringView(fn.constData());

        QJsonArray classesJsonFormatted;

        for (const ClassDef &cdef: std::as_const(classList))
            classesJsonFormatted.append(cdef.toJson());

        if (!classesJsonFormatted.isEmpty())
            mocData["classes"_L1] = classesJsonFormatted;

        QJsonDocument jsonDoc(mocData);
        fputs(jsonDoc.toJson().constData(), jsonOutput);
    }
}